

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard-graphics.cpp
# Opt level: O3

string * __thiscall
Game::Gameboard::Graphics::GameBoardTextOutput_abi_cxx11_
          (string *__return_storage_ptr__,Graphics *this,GameBoard *gb)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  _Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *p_Var4;
  string *psVar5;
  point2D_t *pt;
  pointer ptVar6;
  char *pcVar7;
  uint uVar8;
  pointer ptVar9;
  pointer ptVar10;
  long *plVar11;
  tile_t tVar12;
  tile_t currentTile;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  vertibar;
  ostringstream str_os;
  string *local_328;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  long local_2d0;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_2c8;
  unsigned_long local_2b0;
  undefined1 local_2a8 [24];
  unsigned_long local_290;
  long *local_288 [2];
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258 [2];
  undefined1 local_248 [32];
  undefined1 local_228 [16];
  pointer local_218;
  _Head_base<0UL,_unsigned_long,_false> local_210;
  string local_208 [8];
  string local_200 [8];
  string local_1f8 [48];
  char *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_2c8,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)this);
  local_2b0 = *(unsigned_long *)(this + 0x18);
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_228,&local_2c8);
  local_210._M_head_impl = local_2b0;
  sVar2 = getPlaySizeOfGameboardDataArray((gameboard_data_array_t *)local_228);
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
  }
  lVar3 = 0x10;
  do {
    *(string **)(local_208 + lVar3 + -0x10) = local_208 + lVar3;
    *(undefined8 *)(local_208 + lVar3 + -8) = 0;
    local_208[lVar3] = (string)0x0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x70);
  local_318._0_8_ = anon_var_dwarf_37a9a + 0x54;
  local_318._8_8_ = anon_var_dwarf_12fc3;
  local_308._M_allocated_capacity = (size_type)anon_var_dwarf_12fad;
  local_308._8_8_ = (long)anon_var_dwarf_8de2f + 0xf9;
  local_2f8 = anon_var_dwarf_12fe1;
  local_2f0 = anon_var_dwarf_12fd7;
  local_2e8 = anon_var_dwarf_37ab0 + 0x54;
  local_2e0 = anon_var_dwarf_12fff;
  local_2d8 = anon_var_dwarf_12ff5;
  uVar1 = (uint)sVar2;
  local_328 = local_208;
  lVar3 = 0;
  do {
    local_2d0 = lVar3;
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const*,char_const*,char_const*>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               local_2a8,
               (_Tuple_impl<0UL,_const_char_*,_const_char_*,_const_char_*> *)(local_318 + lVar3));
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_268,local_260);
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,anon_var_dwarf_8de59 + 0xc,0x12);
        p_Var4 = (_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
                 local_2a8;
        if ((int)uVar8 < (int)(uVar1 - 1)) {
          p_Var4 = (_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    *)local_288;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)p_Var4,
                   *(long *)(local_2a8 + (ulong)((int)uVar8 < (int)(uVar1 - 1)) * 0x20 + 8));
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::operator=(local_328,(string *)local_248);
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      operator_delete((void *)local_248._0_8_,(ulong)((long)(ull *)local_248._16_8_ + 1));
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,(ulong)((long)(ull *)local_2a8._16_8_ + 1));
    }
    lVar3 = local_2d0 + 0x18;
    local_328 = local_328 + 0x20;
  } while (lVar3 != 0x48);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (0 < (int)uVar1) {
    ptVar9 = (pointer)0x0;
    do {
      psVar5 = local_1f8 + 0x10;
      if (ptVar9 == (pointer)0x0) {
        psVar5 = local_208;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,*(char **)psVar5,
                 *(long *)(local_1f8 + (ulong)(ptVar9 != (pointer)0x0) * 0x20 + -8));
      ptVar6 = (pointer)0x0;
      ptVar10 = ptVar9;
      do {
        pcVar7 = " ";
        if (ptVar6 == (pointer)0x0) {
          pcVar7 = "  ";
        }
        std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
                  ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)local_2a8,&local_2c8);
        local_290 = local_2b0;
        local_248._0_8_ = ptVar10;
        tVar12 = getTileOnGameboardDataArray
                           ((Game *)local_2a8,(gameboard_data_array_t *)local_248,pt);
        if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar7,(ulong)(ptVar6 == (pointer)0x0) + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,anon_var_dwarf_8df21 + 2,4);
        currentTile.value = (ulong)(tVar12._8_4_ & 0xff);
        currentTile._8_8_ = psVar5;
        drawTileString_abi_cxx11_((string *)local_318,(Game *)tVar12.value,currentTile);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_318._0_8_,local_318._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._0_8_ != &local_308) {
          operator_delete((void *)local_318._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
        }
        ptVar6 = (pointer)((long)&ptVar6->value + 1);
        ptVar10 = ptVar10 + 0x10000000;
      } while ((pointer)(ulong)(uVar1 & 0x7fffffff) != ptVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,anon_var_dwarf_12f99,4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ptVar9 = (pointer)((long)&ptVar9->value + 1);
    } while (ptVar9 != (pointer)(ulong)(uVar1 & 0x7fffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1c8,local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  lVar3 = -0x60;
  plVar11 = local_1b8;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if (local_2c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GameBoardTextOutput(GameBoard gb) {
  return drawSelf(gb.gbda);
}